

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O1

Dar_Cut_t * Dar_ObjComputeCuts(Dar_Man_t *p,Aig_Obj_t *pObj,int fSkipTtMin)

{
  Vec_Ptr_t *pVVar1;
  int Var;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  ulong uVar7;
  Dar_Cut_t *pDVar8;
  Dar_Cut_t *pDVar9;
  long lVar10;
  sbyte sVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  Dar_Cut_t *pDVar17;
  Dar_Cut_t *pDVar18;
  ulong uVar19;
  Dar_Cut_t *pDVar20;
  ulong uVar21;
  Dar_Cut_t *pDVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  void *pvVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  bool bVar32;
  
  pAVar4 = Aig_ObjReal_rec(pObj->pFanin0);
  pAVar5 = Aig_ObjReal_rec(pObj->pFanin1);
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2eb,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ec,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("Dar_ObjCuts(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ed,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  uVar6 = (ulong)pAVar4 & 0xfffffffffffffffe;
  if (*(long *)(uVar6 + 0x28) == 0) {
    __assert_fail("Dar_ObjCuts(pFaninR0) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ee,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  uVar7 = (ulong)pAVar5 & 0xfffffffffffffffe;
  if (*(long *)(uVar7 + 0x28) == 0) {
    __assert_fail("Dar_ObjCuts(pFaninR1) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ef,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  pDVar8 = Dar_ObjPrepareCuts(p,pObj);
  if (*(char *)(uVar6 + 0x1f) != '\0') {
    pDVar18 = *(Dar_Cut_t **)(uVar6 + 0x28);
    uVar13 = 0;
    do {
      if (((pDVar18->field_0x7 & 0x10) != 0) && (0xffffffffffffff < *(ulong *)(uVar7 + 0x18))) {
        pDVar17 = *(Dar_Cut_t **)(uVar7 + 0x28);
        uVar31 = 0;
        do {
          if (((pDVar17->field_0x7 & 0x10) != 0) &&
             (p->nCutsAll = p->nCutsAll + 1, uVar2 = pDVar17->uSign | pDVar18->uSign,
             uVar2 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555),
             uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
             uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707),
             uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f),
             (uVar2 >> 0x10) + (uVar2 & 0xffff) < 5)) {
            uVar21 = *(ulong *)&pObj->field_0x18;
            pDVar9 = (Dar_Cut_t *)(pObj->field_5).pData;
            uVar14 = uVar21 >> 0x38;
            if (uVar21 < 0x100000000000000) {
              pDVar20 = (Dar_Cut_t *)0x0;
            }
            else {
              pDVar20 = (Dar_Cut_t *)0x0;
              uVar19 = uVar14;
              pDVar22 = pDVar9;
              do {
                uVar2 = *(uint *)&pDVar22->field_0x4;
                if ((uVar2 >> 0x1c & 1) == 0) goto LAB_004f31a2;
                if ((0x5fffffff < uVar2) &&
                   ((pDVar20 == (Dar_Cut_t *)0x0 ||
                    ((uVar2 >> 0x10 & 0x7ff) < (*(ushort *)&pDVar20->field_0x6 & 0x7ff))))) {
                  pDVar20 = pDVar22;
                }
                pDVar22 = pDVar22 + 1;
                uVar2 = (int)uVar19 - 1;
                uVar19 = (ulong)uVar2;
              } while (uVar2 != 0);
            }
            if ((0xffffffffffffff < uVar21) && (pDVar20 == (Dar_Cut_t *)0x0)) {
              pDVar20 = (Dar_Cut_t *)0x0;
              uVar19 = uVar14;
              pDVar22 = pDVar9;
              do {
                if ((0x3fffffff < *(uint *)&pDVar22->field_0x4) &&
                   ((pDVar20 == (Dar_Cut_t *)0x0 ||
                    ((*(uint *)&pDVar22->field_0x4 >> 0x10 & 0x7ff) <
                     (*(ushort *)&pDVar20->field_0x6 & 0x7ff))))) {
                  pDVar20 = pDVar22;
                }
                pDVar22 = pDVar22 + 1;
                uVar2 = (int)uVar19 - 1;
                uVar19 = (ulong)uVar2;
              } while (uVar2 != 0);
            }
            if ((0xffffffffffffff < uVar21) && (pDVar20 == (Dar_Cut_t *)0x0)) {
              pDVar20 = (Dar_Cut_t *)0x0;
              do {
                if ((pDVar20 == (Dar_Cut_t *)0x0) ||
                   ((*(ushort *)&pDVar9->field_0x6 & 0x7ff) <
                    (*(ushort *)&pDVar20->field_0x6 & 0x7ff))) {
                  pDVar20 = pDVar9;
                }
                pDVar9 = pDVar9 + 1;
                uVar2 = (int)uVar14 - 1;
                uVar14 = (ulong)uVar2;
              } while (uVar2 != 0);
            }
            if (pDVar20 == (Dar_Cut_t *)0x0) {
              __assert_fail("pCutMax != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                            ,0xae,"Dar_Cut_t *Dar_CutFindFree(Dar_Man_t *, Aig_Obj_t *)");
            }
            pDVar20->field_0x7 = pDVar20->field_0x7 & 0xef;
            pDVar22 = pDVar20;
LAB_004f31a2:
            if ((pDVar22->field_0x7 & 0x10) != 0) {
              __assert_fail("!pCut->fUsed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                            ,0x169,"int Dar_CutMerge(Dar_Cut_t *, Dar_Cut_t *, Dar_Cut_t *)");
            }
            pDVar9 = pDVar18;
            pDVar20 = pDVar17;
            if (*(uint *)&pDVar17->field_0x4 >> 0x1d < *(uint *)&pDVar18->field_0x4 >> 0x1d) {
              pDVar9 = pDVar17;
              pDVar20 = pDVar18;
            }
            iVar3 = Dar_CutMergeOrdered(pDVar22,pDVar20,pDVar9);
            if (iVar3 == 0) {
              if ((pDVar22->field_0x7 & 0x10) != 0) {
                __assert_fail("!pCut->fUsed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                              ,0x300,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)")
                ;
              }
            }
            else {
              pDVar22->uSign = pDVar17->uSign | pDVar18->uSign;
              pDVar22->field_0x7 = pDVar22->field_0x7 | 0x10;
              p->nCutsTried = p->nCutsTried + 1;
              iVar3 = Dar_CutFilter(pObj,pDVar22);
              if (iVar3 == 0) {
                uVar15 = *(uint *)&pDVar17->field_0x4 ^ -((uint)pAVar5 & 1);
                uVar16 = *(uint *)&pDVar18->field_0x4 >> 0x1d;
                uVar2 = *(uint *)&pDVar22->field_0x4;
                uVar23 = 0;
                if (0x1fffffff < uVar2) {
                  uVar21 = 0;
                  uVar24 = 0;
                  uVar23 = 0;
                  do {
                    if (uVar24 == uVar16) break;
                    if (pDVar18->pLeaves[(int)uVar24] <= pDVar22->pLeaves[uVar21]) {
                      if (pDVar22->pLeaves[uVar21] != pDVar18->pLeaves[(int)uVar24])
                      goto LAB_004f3866;
                      uVar23 = uVar23 | 1 << ((uint)uVar21 & 0x1f);
                      uVar24 = uVar24 + 1;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar2 >> 0x1d != uVar21);
                }
                uVar24 = *(uint *)&pDVar18->field_0x4 ^ -((uint)pAVar4 & 1);
                uVar16 = uVar16 - 1;
                uVar25 = 3;
                iVar3 = 2;
                do {
                  if ((uVar23 >> (uVar25 & 0x1f) & 1) != 0) {
                    if ((int)uVar16 < (int)uVar25) {
                      uVar12 = 3 - uVar16;
                      if (3 < uVar16) {
                        uVar12 = 0;
                      }
                      uVar27 = uVar16;
                      if (uVar12 <= iVar3 - uVar16) goto LAB_004f3828;
                      do {
                        if (uVar27 == 0) {
                          uVar12 = 0x22222222;
                          uVar28 = 0x44444444;
                          sVar11 = 1;
                          uVar30 = 0x99999999;
                        }
                        else if (uVar27 == 1) {
                          uVar12 = 0xc0c0c0c;
                          uVar28 = 0x30303030;
                          sVar11 = 2;
                          uVar30 = 0xc3c3c3c3;
                        }
                        else {
                          uVar12 = 0xf000f0;
                          uVar28 = 0xf000f00;
                          sVar11 = 4;
                          uVar30 = 0xf00ff00f;
                        }
                        uVar24 = uVar24 >> sVar11 & uVar12 |
                                 uVar24 << sVar11 & uVar28 | uVar30 & uVar24;
                        uVar27 = uVar27 + 1;
                      } while ((int)uVar27 < (int)uVar25);
                    }
                    uVar16 = uVar16 - 1;
                  }
                  iVar3 = iVar3 + -1;
                  bVar32 = uVar25 != 0;
                  uVar25 = uVar25 - 1;
                } while (bVar32);
                if (uVar16 != 0xffffffff) {
LAB_004f38c3:
                  __assert_fail("Var == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                ,0x1e0,
                                "unsigned int Dar_CutTruthStretch(unsigned int, int, unsigned int)")
                  ;
                }
                uVar16 = *(uint *)&pDVar17->field_0x4 >> 0x1d;
                uVar23 = 0;
                if (0x1fffffff < uVar2) {
                  uVar21 = 0;
                  uVar25 = 0;
                  uVar23 = 0;
                  do {
                    if (uVar25 == uVar16) break;
                    if (pDVar17->pLeaves[(int)uVar25] <= pDVar22->pLeaves[uVar21]) {
                      if (pDVar22->pLeaves[uVar21] != pDVar17->pLeaves[(int)uVar25]) {
LAB_004f3866:
                        __assert_fail("pCut->pLeaves[i] == pCut1->pLeaves[k]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                      ,400,
                                      "unsigned int Dar_CutTruthPhase(Dar_Cut_t *, Dar_Cut_t *)");
                      }
                      uVar23 = uVar23 | 1 << ((uint)uVar21 & 0x1f);
                      uVar25 = uVar25 + 1;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar2 >> 0x1d != uVar21);
                }
                uVar16 = uVar16 - 1;
                uVar25 = 3;
                iVar3 = 2;
                do {
                  if ((uVar23 >> (uVar25 & 0x1f) & 1) != 0) {
                    if ((int)uVar16 < (int)uVar25) {
                      uVar12 = 3 - uVar16;
                      if (3 < uVar16) {
                        uVar12 = 0;
                      }
                      uVar27 = uVar16;
                      if (uVar12 <= iVar3 - uVar16) {
LAB_004f3828:
                        __assert_fail("iVar >= 0 && iVar <= 2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                      ,0x1a4,
                                      "unsigned int Dar_CutTruthSwapAdjacentVars(unsigned int, int)"
                                     );
                      }
                      do {
                        if (uVar27 == 0) {
                          uVar12 = 0x22222222;
                          uVar28 = 0x44444444;
                          sVar11 = 1;
                          uVar30 = 0x99999999;
                        }
                        else if (uVar27 == 1) {
                          uVar12 = 0xc0c0c0c;
                          uVar28 = 0x30303030;
                          sVar11 = 2;
                          uVar30 = 0xc3c3c3c3;
                        }
                        else {
                          uVar12 = 0xf000f0;
                          uVar28 = 0xf000f00;
                          sVar11 = 4;
                          uVar30 = 0xf00ff00f;
                        }
                        uVar15 = uVar15 >> sVar11 & uVar12 |
                                 uVar15 << sVar11 & uVar28 | uVar30 & uVar15;
                        uVar27 = uVar27 + 1;
                      } while ((int)uVar27 < (int)uVar25);
                    }
                    uVar16 = uVar16 - 1;
                  }
                  iVar3 = iVar3 + -1;
                  bVar32 = uVar25 != 0;
                  uVar25 = uVar25 - 1;
                } while (bVar32);
                if (uVar16 != 0xffffffff) goto LAB_004f38c3;
                uVar24 = uVar24 & uVar15;
                uVar15 = uVar24 & 0xffff;
                *(uint *)&pDVar22->field_0x4 = (uVar24 & 0xffff) + (uVar2 & 0xffff0000);
                if (fSkipTtMin == 0) {
                  if ((uVar2 >> 0x1c & 1) == 0) {
                    __assert_fail("pCut->fUsed",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                  ,0x262,"int Dar_CutSuppMinimize(Dar_Cut_t *)");
                  }
                  uVar16 = uVar2 >> 0x1d;
                  uVar25 = 0;
                  uVar23 = uVar16;
                  if (0x1fffffff < uVar2) {
                    uVar14 = 0;
                    uVar25 = 0;
                    uVar21 = (ulong)uVar16;
                    do {
                      uVar23 = 1 << ((byte)uVar14 & 0x1f);
                      bVar32 = ((&DAT_009e8dd0)[uVar14 * 2] & uVar24 & 0xffff) ==
                               ((&DAT_009e8dd4)[uVar14 * 2] & uVar24 & 0xffff) >>
                               ((byte)uVar23 & 0x1f);
                      if (bVar32) {
                        uVar23 = 0;
                      }
                      uVar25 = uVar25 | uVar23;
                      uVar23 = (int)uVar21 - (uint)bVar32;
                      uVar21 = (ulong)uVar23;
                      uVar14 = uVar14 + 1;
                    } while (uVar16 != uVar14);
                  }
                  if (uVar23 != uVar16) {
                    iVar3 = 0;
                    uVar24 = 0;
                    do {
                      uVar12 = uVar24;
                      if ((uVar25 >> (uVar24 & 0x1f) & 1) != 0) {
                        while (iVar3 < (int)uVar12) {
                          uVar27 = uVar12 - 1;
                          if (2 < uVar27) goto LAB_004f3828;
                          if (uVar12 == 2) {
                            uVar28 = 0xc0c0c0c;
                            uVar30 = 0x30303030;
                            uVar29 = 0xc3c3c3c3;
                          }
                          else if (uVar12 == 1) {
                            uVar28 = 0x22222222;
                            uVar30 = 0x44444444;
                            uVar29 = 0x99999999;
                          }
                          else {
                            uVar28 = 0xf000f0;
                            uVar30 = 0xf000f00;
                            uVar12 = 4;
                            uVar29 = 0xf00ff00f;
                          }
                          uVar15 = uVar15 >> ((byte)uVar12 & 0x1f) & uVar28 |
                                   uVar15 << ((byte)uVar12 & 0x1f) & uVar30 | uVar29 & uVar15;
                          uVar12 = uVar27;
                        }
                        iVar3 = iVar3 + 1;
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != 4);
                    uVar15 = uVar15 & 0xffff | uVar2 & 0xffff0000;
                    uVar24 = 0;
                    *(uint *)&pDVar22->field_0x4 = uVar15;
                    pDVar22->uSign = 0;
                    if (0x1fffffff < uVar2) {
                      uVar21 = 0;
                      uVar24 = 0;
                      do {
                        if ((uVar25 >> ((uint)uVar21 & 0x1f) & 1) != 0) {
                          pDVar22->pLeaves[(int)uVar24] = pDVar22->pLeaves[uVar21];
                          uVar24 = uVar24 + 1;
                          pDVar22->uSign =
                               pDVar22->uSign | 1 << ((byte)pDVar22->pLeaves[uVar21] & 0x1f);
                        }
                        uVar21 = uVar21 + 1;
                        uVar15 = *(uint *)&pDVar22->field_0x4;
                      } while (uVar21 < uVar15 >> 0x1d);
                    }
                    if (uVar24 != uVar23) {
                      __assert_fail("k == nLeaves",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                    ,0x278,"int Dar_CutSuppMinimize(Dar_Cut_t *)");
                    }
                    *(uint *)&pDVar22->field_0x4 = uVar15 & 0x1fffffff | uVar23 << 0x1d;
                    if ((uVar23 != uVar16) && (iVar3 = Dar_CutFilter(pObj,pDVar22), iVar3 != 0)) {
                      __assert_fail("!RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                    ,0x311,
                                    "Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
                    }
                  }
                }
                uVar2 = *(uint *)&pDVar22->field_0x4;
                if ((uVar2 >> 0x1c & 1) == 0) {
                  __assert_fail("pCut->fUsed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                ,0x6e,"int Dar_CutFindValue(Dar_Man_t *, Dar_Cut_t *)");
                }
                uVar15 = 0;
                uVar16 = 0;
                if (0x1fffffff < uVar2) {
                  pVVar1 = p->pAig->vObjs;
                  uVar21 = 0;
                  uVar16 = 0;
                  uVar15 = 0;
                  do {
                    if (pVVar1 == (Vec_Ptr_t *)0x0) {
                      pvVar26 = (void *)0x0;
                    }
                    else {
                      uVar23 = pDVar22->pLeaves[uVar21];
                      if (((int)uVar23 < 0) || (pVVar1->nSize <= (int)uVar23)) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                      }
                      pvVar26 = pVVar1->pArray[uVar23];
                    }
                    if (pvVar26 == (void *)0x0) {
                      uVar23 = 0;
                      goto LAB_004f372a;
                    }
                    uVar23 = *(uint *)((long)pvVar26 + 0x18) >> 6;
                    uVar15 = uVar15 + uVar23;
                    uVar16 = uVar16 + (uVar23 == 1);
                    uVar21 = uVar21 + 1;
                  } while (uVar2 >> 0x1d != uVar21);
                }
                uVar23 = 0x3e9;
                if (0x3fffffff < uVar2) {
                  if (999 < uVar15) {
                    uVar15 = 1000;
                  }
                  uVar23 = 5 - uVar16;
                  if (uVar16 < 4) {
                    uVar23 = uVar15;
                  }
                }
LAB_004f372a:
                *(uint *)&pDVar22->field_0x4 = uVar2 & 0xf800ffff | (uVar23 & 0x7ff) << 0x10;
                if ((uVar23 & 0x7ff) == 0) {
                  p->nCutsSkipped = p->nCutsSkipped + 1;
                  pDVar22->field_0x7 = pDVar22->field_0x7 & 0xef;
                }
                else if (uVar2 < 0x40000000) {
                  return pDVar8;
                }
              }
              else if ((pDVar22->field_0x7 & 0x10) != 0) {
                __assert_fail("!pCut->fUsed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                              ,0x307,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)")
                ;
              }
            }
          }
          uVar31 = uVar31 + 1;
          pDVar17 = pDVar17 + 1;
        } while (uVar31 < *(byte *)(uVar7 + 0x1f));
      }
      uVar13 = uVar13 + 1;
      pDVar18 = pDVar18 + 1;
    } while (uVar13 < *(byte *)(uVar6 + 0x1f));
  }
  if (0xffffffffffffff < *(ulong *)&pObj->field_0x18) {
    lVar10 = (long)(pObj->field_5).pData + 4;
    uVar13 = 0;
    do {
      if ((*(byte *)(lVar10 + 3) & 0x10) != 0) {
        p->nCutsUsed = p->nCutsUsed + 1;
      }
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 0x18;
    } while (uVar13 < (byte)pObj->field_0x1f);
  }
  p->nCutsUsed = p->nCutsUsed + -1;
  return pDVar8;
}

Assistant:

Dar_Cut_t * Dar_ObjComputeCuts( Dar_Man_t * p, Aig_Obj_t * pObj, int fSkipTtMin )
{
    Aig_Obj_t * pFanin0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
    Aig_Obj_t * pFanin1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
    Aig_Obj_t * pFaninR0 = Aig_Regular(pFanin0);
    Aig_Obj_t * pFaninR1 = Aig_Regular(pFanin1);
    Dar_Cut_t * pCutSet, * pCut0, * pCut1, * pCut;
    int i, k; 

    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    assert( Dar_ObjCuts(pObj) == NULL );
    assert( Dar_ObjCuts(pFaninR0) != NULL );
    assert( Dar_ObjCuts(pFaninR1) != NULL );

    // set up the first cut
    pCutSet = Dar_ObjPrepareCuts( p, pObj );
    // make sure fanins cuts are computed
    Dar_ObjForEachCut( pFaninR0, pCut0, i )
    Dar_ObjForEachCut( pFaninR1, pCut1, k )
    {
        p->nCutsAll++;
        // make sure K-feasible cut exists
        if ( Dar_WordCountOnes(pCut0->uSign | pCut1->uSign) > 4 )
            continue;
        // get the next cut of this node
        pCut = Dar_CutFindFree( p, pObj );
        // create the new cut
        if ( !Dar_CutMerge( pCut, pCut0, pCut1 ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        p->nCutsTried++;
        // check dominance
        if ( Dar_CutFilter( pObj, pCut ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        // compute truth table
        pCut->uTruth = 0xFFFF & Dar_CutTruth( pCut, pCut0, pCut1, Aig_IsComplement(pFanin0), Aig_IsComplement(pFanin1) );

        // minimize support of the cut
        if ( !fSkipTtMin && Dar_CutSuppMinimize( pCut ) )
        {
            int RetValue = Dar_CutFilter( pObj, pCut );
            assert( !RetValue );
        }

        // assign the value of the cut
        pCut->Value = Dar_CutFindValue( p, pCut );
        // if the cut contains removed node, do not use it
        if ( pCut->Value == 0 )
        {
            p->nCutsSkipped++;
            pCut->fUsed = 0;
        }
        else if ( pCut->nLeaves < 2 )
            return pCutSet;
    }
    // count the number of nontrivial cuts cuts
    Dar_ObjForEachCut( pObj, pCut, i )
        p->nCutsUsed += pCut->fUsed;
    // discount trivial cut
    p->nCutsUsed--;
    return pCutSet;
}